

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

int server_write_header(FMContext fmc,int enc_len,uchar *enc_buffer)

{
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int key_len;
  int server_pid;
  int magic;
  int in_stack_ffffffffffffffd8;
  int byte_reversal;
  uint in_stack_ffffffffffffffe8;
  int iVar1;
  int local_4;
  
  byte_reversal = 0x4356ffac;
  if (in_ESI == 0) {
    put_serverAtomicInt((void *)(ulong)in_stack_ffffffffffffffe8,in_RDX,
                        (FMContext)CONCAT44(0x4356ffac,in_stack_ffffffffffffffd8));
    put_serverAtomicInt((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                        (FMContext)CONCAT44(byte_reversal,in_stack_ffffffffffffffd8));
    iVar1 = in_ESI;
  }
  else {
    iVar1 = in_ESI;
    put_serverAtomicInt((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                        (FMContext)CONCAT44(0x4356ffac,in_stack_ffffffffffffffd8));
    put_serverAtomicInt((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),in_RDX,
                        (FMContext)CONCAT44(byte_reversal,in_stack_ffffffffffffffd8));
    serverAtomicWrite(in_RDX,(void *)CONCAT44(byte_reversal,in_stack_ffffffffffffffd8),in_ESI);
  }
  get_serverAtomicInt((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),in_RDX,byte_reversal);
  get_serverAtomicInt((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),in_RDX,byte_reversal);
  get_serverAtomicInt((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),in_RDX,byte_reversal);
  if ((*(int *)(in_RDI + 0x48) == 0) || (*(int *)(in_RDI + 0x48) == in_stack_ffffffffffffffd8)) {
    *(int *)(in_RDI + 0x48) = in_stack_ffffffffffffffd8;
    if (byte_reversal != 0x4356ffa9) {
      if (byte_reversal != -0x5600a9bd) {
        return -1;
      }
      *(undefined4 *)(in_RDI + 0x50) = 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

extern int
server_write_header(FMContext fmc, int enc_len, unsigned char *enc_buffer)
{
    FILE_INT magic = MAGIC_NUMBER + CURRENT_PROTOCOL_VERSION;
    FILE_INT server_pid;
    if (enc_len == 0) {
	put_serverAtomicInt(fmc->server_fd, &magic, fmc);
	put_serverAtomicInt(fmc->server_fd, &enc_len, fmc);
    } else {
	FILE_INT key_len = enc_len;
	put_serverAtomicInt(fmc->server_fd, &magic, fmc);
	put_serverAtomicInt(fmc->server_fd, &key_len, fmc);
	serverAtomicWrite(fmc->server_fd, enc_buffer, key_len);
    }	
    get_serverAtomicInt(fmc->server_fd, &magic, 0);
    get_serverAtomicInt(fmc->server_fd, &server_pid, 0);
    get_serverAtomicInt(fmc->server_fd, &fmc->format_server_identifier, 0);
    if ((fmc->server_pid != 0) && (fmc->server_pid != server_pid)) {
	return 0;
    } else {
	fmc->server_pid = server_pid;
    }
    if (magic != MAGIC_NUMBER) {
	if (magic == REVERSE_MAGIC_NUMBER) {
	    fmc->server_byte_reversal = 1;
	} else {
	    /* close client */
	    return -1;
	}
    }
    return 1;
}